

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall TPZMatrix<Fad<double>_>::Decompose_LU(TPZMatrix<Fad<double>_> *this)

{
  byte bVar1;
  int64_t iVar2;
  int64_t iVar3;
  Fad<double> *fadexpr;
  Fad<double> *v;
  TPZBaseMatrix *in_RDI;
  char *in_stack_00000018;
  char *in_stack_00000020;
  int64_t j;
  int64_t i;
  int64_t k;
  int64_t min;
  Fad<double> pivot;
  Fad<double> nn;
  Fad<double> *in_stack_fffffffffffffe18;
  Fad<double> *in_stack_fffffffffffffe20;
  Fad<double> *in_stack_fffffffffffffe28;
  Fad<double> *in_stack_fffffffffffffe30;
  FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_> *in_stack_fffffffffffffe38;
  Fad<double> *pFVar4;
  undefined7 in_stack_fffffffffffffe50;
  Fad<double> *in_stack_fffffffffffffe70;
  undefined1 local_170 [48];
  undefined1 local_140 [48];
  undefined1 local_110 [32];
  Fad<double> *local_f0;
  undefined1 local_e8 [48];
  Fad<double> *local_b8;
  undefined1 local_b0 [64];
  Fad<double> *local_70;
  Fad<double> *local_68;
  undefined1 local_30 [44];
  int local_4;
  
  if ((in_RDI->fDecomposed != '\0') && (in_RDI->fDecomposed != '\x01')) {
    Error(in_stack_00000020,in_stack_00000018);
  }
  if (in_RDI->fDecomposed == '\0') {
    Fad<double>::Fad(in_stack_fffffffffffffe30);
    Fad<double>::Fad(in_stack_fffffffffffffe30);
    iVar2 = TPZBaseMatrix::Cols(in_RDI);
    iVar3 = TPZBaseMatrix::Rows(in_RDI);
    if (iVar2 < iVar3) {
      fadexpr = (Fad<double> *)TPZBaseMatrix::Cols(in_RDI);
      in_stack_fffffffffffffe70 = fadexpr;
    }
    else {
      fadexpr = (Fad<double> *)TPZBaseMatrix::Rows(in_RDI);
    }
    local_68 = fadexpr;
    for (local_70 = (Fad<double> *)0x0; (long)local_70 < (long)local_68;
        local_70 = (Fad<double> *)((long)&local_70->val_ + 1)) {
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_b0,in_RDI,local_70);
      v = Fad<double>::operator=(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      Fad<double>::Fad(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      bVar1 = IsZero<Fad<double>>(in_stack_fffffffffffffe20);
      Fad<double>::~Fad(in_stack_fffffffffffffe20);
      Fad<double>::~Fad(in_stack_fffffffffffffe20);
      pFVar4 = local_70;
      if ((bVar1 & 1) != 0) {
        Error(in_stack_00000020,in_stack_00000018);
        pFVar4 = local_70;
      }
      while( true ) {
        local_b8 = (Fad<double> *)((long)&pFVar4->val_ + 1);
        pFVar4 = local_b8;
        iVar2 = TPZBaseMatrix::Rows(in_RDI);
        if (iVar2 <= (long)pFVar4) break;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_e8,in_RDI,local_b8,local_70);
        operator/<Fad<double>,_Fad<double>,_nullptr>
                  (v,(Fad<double> *)CONCAT17(bVar1,in_stack_fffffffffffffe50));
        Fad<double>::operator=(pFVar4,in_stack_fffffffffffffe38);
        FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffe20);
        Fad<double>::~Fad(in_stack_fffffffffffffe20);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,local_b8,local_70,local_30);
        local_f0 = local_70;
        while( true ) {
          local_f0 = (Fad<double> *)((long)&local_f0->val_ + 1);
          in_stack_fffffffffffffe30 = local_f0;
          in_stack_fffffffffffffe38 =
               (FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_> *)TPZBaseMatrix::Cols(in_RDI);
          pFVar4 = local_b8;
          if ((long)in_stack_fffffffffffffe38 <= (long)in_stack_fffffffffffffe30) break;
          in_stack_fffffffffffffe20 = local_b8;
          in_stack_fffffffffffffe28 = local_f0;
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_140);
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_170,in_RDI,local_70,local_f0);
          operator*<Fad<double>,_Fad<double>,_nullptr>
                    (v,(Fad<double> *)CONCAT17(bVar1,in_stack_fffffffffffffe50));
          operator-<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_nullptr>
                    (v,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)
                       CONCAT17(bVar1,in_stack_fffffffffffffe50));
          Fad<double>::
          Fad<FadBinaryMinus<Fad<double>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>
                    (in_stack_fffffffffffffe70,
                     (FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
                      *)fadexpr);
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                    (in_RDI,in_stack_fffffffffffffe20,in_stack_fffffffffffffe28,local_110);
          Fad<double>::~Fad(in_stack_fffffffffffffe20);
          FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
          ::~FadExpr((FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
                      *)in_stack_fffffffffffffe20);
          FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                    ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffe20)
          ;
          Fad<double>::~Fad(in_stack_fffffffffffffe20);
          Fad<double>::~Fad(in_stack_fffffffffffffe20);
        }
      }
    }
    in_RDI->fDecomposed = '\x01';
    local_4 = 1;
    Fad<double>::~Fad(in_stack_fffffffffffffe20);
    Fad<double>::~Fad(in_stack_fffffffffffffe20);
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int TPZMatrix<TVar>::Decompose_LU() {
	
	if (  fDecomposed && fDecomposed != ELU)  Error( "Decompose_LU <Matrix already Decomposed with other scheme>" );
	if (fDecomposed) return 1;
	
	TVar nn, pivot;
	int64_t  min = ( Cols() < (Rows()) ) ? Cols() : Rows();
	
	for ( int64_t k = 0; k < min ; k++ ) {
		if (IsZero( pivot = GetVal(k, k))) Error( "Decompose_LU <matrix is singular>" );
		for ( int64_t i = k+1; i < Rows(); i++ ) {
			nn = GetVal( i, k ) / pivot;
			PutVal( i, k, nn );
			for ( int64_t j = k+1; j < Cols(); j++ ) PutVal(i,j,GetVal(i,j)-nn*GetVal(k,j));
		}
	}
	fDecomposed=ELU;
	return 1;
}